

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idec_dec.c
# Opt level: O2

VP8StatusCode WebPIAppend(WebPIDecoder *idec,uint8_t *data,size_t data_size)

{
  size_t *psVar1;
  MemBufferMode MVar2;
  void *pvVar3;
  int iVar4;
  VP8StatusCode VVar5;
  uint8_t *__dest;
  uint8_t *puVar6;
  uint8_t *__src;
  ulong nmemb;
  size_t __n;
  
  VVar5 = VP8_STATUS_INVALID_PARAM;
  if (data != (uint8_t *)0x0 && idec != (WebPIDecoder *)0x0) {
    VVar5 = VP8_STATUS_BITSTREAM_ERROR;
    if (idec->state != STATE_ERROR) {
      VVar5 = (uint)(idec->state != STATE_DONE) * 5;
    }
    if (VVar5 == VP8_STATUS_SUSPENDED) {
      MVar2 = (idec->mem).mode;
      if (MVar2 != MEM_MODE_APPEND) {
        if (MVar2 != MEM_MODE_NONE) {
          return VP8_STATUS_INVALID_PARAM;
        }
        (idec->mem).mode = MEM_MODE_APPEND;
      }
      pvVar3 = idec->dec;
      iVar4 = NeedCompressedAlpha(idec);
      __dest = (idec->mem).buf;
      if (__dest == (uint8_t *)0x0) {
        puVar6 = (uint8_t *)0x0;
      }
      else {
        puVar6 = __dest + (idec->mem).start;
      }
      __src = puVar6;
      if (iVar4 != 0) {
        __src = *(uint8_t **)((long)pvVar3 + 0xb98);
      }
      VVar5 = VP8_STATUS_OUT_OF_MEMORY;
      if (data_size < 0xfffffff7) {
        __n = (idec->mem).end;
        if ((idec->mem).buf_size < data_size + __n) {
          __n = (__n - (idec->mem).start) + ((long)puVar6 - (long)__src);
          nmemb = data_size + __n + 0xfff & 0xfffffffffffff000;
          __dest = (uint8_t *)WebPSafeMalloc(nmemb,1);
          if (__dest == (uint8_t *)0x0) {
            return VP8_STATUS_OUT_OF_MEMORY;
          }
          if (__src != (uint8_t *)0x0) {
            memcpy(__dest,__src,__n);
          }
          WebPSafeFree((idec->mem).buf);
          (idec->mem).buf = __dest;
          (idec->mem).buf_size = nmemb;
          (idec->mem).start = (long)puVar6 - (long)__src;
          (idec->mem).end = __n;
        }
        memcpy(__dest + __n,data,data_size);
        psVar1 = &(idec->mem).end;
        *psVar1 = *psVar1 + data_size;
        DoRemap(idec,(ptrdiff_t)((idec->mem).buf + ((idec->mem).start - (long)puVar6)));
        VVar5 = IDecode(idec);
        return VVar5;
      }
    }
  }
  return VVar5;
}

Assistant:

VP8StatusCode WebPIAppend(WebPIDecoder* idec,
                          const uint8_t* data, size_t data_size) {
  VP8StatusCode status;
  if (idec == NULL || data == NULL) {
    return VP8_STATUS_INVALID_PARAM;
  }
  status = IDecCheckStatus(idec);
  if (status != VP8_STATUS_SUSPENDED) {
    return status;
  }
  // Check mixed calls between RemapMemBuffer and AppendToMemBuffer.
  if (!CheckMemBufferMode(&idec->mem, MEM_MODE_APPEND)) {
    return VP8_STATUS_INVALID_PARAM;
  }
  // Append data to memory buffer
  if (!AppendToMemBuffer(idec, data, data_size)) {
    return VP8_STATUS_OUT_OF_MEMORY;
  }
  return IDecode(idec);
}